

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

ParameterValueAssignmentSyntax * __thiscall
slang::parsing::Parser::parseParameterValueAssignment(Parser *this)

{
  Token TVar1;
  bool bVar2;
  int iVar3;
  SourceLocation location;
  ParamAssignmentSyntax *pPVar4;
  undefined4 extraout_var;
  ParameterValueAssignmentSyntax *pPVar5;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  TokenKind TVar6;
  undefined8 uVar7;
  Token hash;
  Token current;
  Token TVar8;
  Token TVar9;
  Token closeParen;
  Token openParen;
  Token local_218;
  Info *local_208;
  Info *local_200;
  undefined8 local_1f8;
  Token local_1f0;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1e0;
  undefined1 local_1d0;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,Hash);
  if (!bVar2) {
    return (ParameterValueAssignmentSyntax *)0x0;
  }
  hash = ParserBase::consume(&this->super_ParserBase);
  Token::Token(&local_1f0);
  Token::Token(&local_218);
  local_1f0 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if (((undefined1  [16])local_1f0 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    location = Token::location(&local_1f0);
    local_218 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,location);
    auStack_1b0._16_8_ = (pointer)0x0;
    auStack_1b0._8_8_ = (Info *)0x0;
    goto LAB_0042e581;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  current = ParserBase::peek(&this->super_ParserBase);
  bVar2 = slang::syntax::SyntaxFacts::isEndOfParenList(current.kind);
  if (bVar2) {
    local_218 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_0042e3af:
    src = local_218.info;
  }
  else {
    bVar2 = slang::syntax::SyntaxFacts::isPossibleParamAssignment(current.kind);
    if (bVar2) {
      do {
        local_208 = current.info;
        uVar7 = current._0_8_;
        local_200 = hash.info;
        local_1f8 = hash._0_8_;
        pPVar4 = parseParamValue(this);
        local_1e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar4;
        local_1d0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1e0._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        TVar6 = TVar8.kind;
        bVar2 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
        TVar8.info = local_208;
        TVar8.kind = (short)uVar7;
        TVar8._2_1_ = (char)((ulong)uVar7 >> 0x10);
        TVar8.numFlags.raw = (char)((ulong)uVar7 >> 0x18);
        TVar8.rawLen = (int)((ulong)uVar7 >> 0x20);
        iVar3 = 3;
        src = extraout_RDX;
        if (TVar6 != EndOfFile && !bVar2) {
          if (TVar6 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar2 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleParamAssignment,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x2d0005,false);
              if (!bVar2) {
                local_218 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                TVar8.info = local_208;
                TVar8.kind = (short)uVar7;
                TVar8._2_1_ = (char)((ulong)uVar7 >> 0x10);
                TVar8.numFlags.raw = (char)((ulong)uVar7 >> 0x18);
                TVar8.rawLen = (int)((ulong)uVar7 >> 0x20);
                src = local_218.info;
                iVar3 = 1;
                goto LAB_0042e513;
              }
              bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar2);
          }
          local_1e0._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_1d0 = 0;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_1e0._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          TVar6 = TVar9.kind;
          bVar2 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
          if (TVar6 == EndOfFile || bVar2) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            TVar8.info = local_208;
            TVar8.kind = (short)uVar7;
            TVar8._2_1_ = (char)((ulong)uVar7 >> 0x10);
            TVar8.numFlags.raw = (char)((ulong)uVar7 >> 0x18);
            TVar8.rawLen = (int)((ulong)uVar7 >> 0x20);
            src = extraout_RDX_01;
          }
          else {
            src = extraout_RDX_00;
            if (local_208 == TVar9.info && current.kind == TVar6) {
              bVar2 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleParamAssignment,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x2d0005,true);
              TVar8.info = local_208;
              TVar8.kind = (short)uVar7;
              TVar8._2_1_ = (char)((ulong)uVar7 >> 0x10);
              TVar8.numFlags.raw = (char)((ulong)uVar7 >> 0x18);
              TVar8.rawLen = (int)((ulong)uVar7 >> 0x20);
              src = extraout_RDX_02;
              if (!bVar2) goto LAB_0042e513;
            }
            iVar3 = 0;
            TVar8 = TVar9;
          }
        }
LAB_0042e513:
        current = TVar8;
        local_208 = current.info;
        hash.info = local_200;
        hash.kind = (undefined2)local_1f8;
        hash._2_1_ = local_1f8._2_1_;
        hash.numFlags.raw = local_1f8._3_1_;
        hash.rawLen = local_1f8._4_4_;
      } while (iVar3 == 0);
      TVar1.info = local_200;
      TVar1.kind = (undefined2)local_1f8;
      TVar1._2_1_ = local_1f8._2_1_;
      TVar1.numFlags.raw = local_1f8._3_1_;
      TVar1.rawLen = local_1f8._4_4_;
      hash.kind = (undefined2)local_1f8;
      hash._2_1_ = local_1f8._2_1_;
      hash.numFlags.raw = local_1f8._3_1_;
      hash.rawLen = local_1f8._4_4_;
      if (iVar3 == 3) {
        local_218 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        hash = TVar1;
        goto LAB_0042e3af;
      }
    }
    else {
      ParserBase::reportMissingList
                (&this->super_ParserBase,current,CloseParenthesis,&local_218,(DiagCode)0x2d0005);
      src = extraout_RDX_03;
    }
  }
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  auStack_1b0._16_8_ = CONCAT44(extraout_var,iVar3);
  auStack_1b0._8_8_ = extraout_RDX_04;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_0042e581:
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_1c8._0_8_ = &PTR_getChild_006a5eb0;
  local_198._M_extent_value = auStack_1b0._8_8_;
  pPVar5 = slang::syntax::SyntaxFactory::parameterValueAssignment
                     (&this->factory,hash,local_1f0,
                      (SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)local_1c8,
                      local_218);
  return pPVar5;
}

Assistant:

ParameterValueAssignmentSyntax* Parser::parseParameterValueAssignment() {
    if (!peek(TokenKind::Hash))
        return nullptr;

    auto hash = consume();

    Token openParen;
    Token closeParen;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleParamAssignment, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, list,
        closeParen, RequireItems::False, diag::ExpectedArgument,
        [this] { return &parseParamValue(); });

    return &factory.parameterValueAssignment(hash, openParen, list, closeParen);
}